

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

QGraphicsItem * __thiscall
QGraphicsScene::itemAt(QGraphicsScene *this,QPointF *position,QTransform *deviceTransform)

{
  QGraphicsItem *pQVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QGraphicsItem_*> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d._0_4_ = 0xaaaaaaaa;
  local_28.d._4_4_ = 0xaaaaaaaa;
  local_28.ptr._0_4_ = 0xaaaaaaaa;
  local_28.ptr._4_4_ = 0xaaaaaaaa;
  (**(code **)(**(long **)(*(long *)(this + 8) + 0x88) + 0x68))
            (&local_28,*(long **)(*(long *)(this + 8) + 0x88),position,1,1,deviceTransform);
  if ((undefined1 *)local_28.size == (undefined1 *)0x0) {
    pQVar1 = (QGraphicsItem *)0x0;
  }
  else {
    pQVar1 = *(QGraphicsItem **)CONCAT44(local_28.ptr._4_4_,local_28.ptr._0_4_);
  }
  QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return pQVar1;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsItem *QGraphicsScene::itemAt(const QPointF &position, const QTransform &deviceTransform) const
{
    const QList<QGraphicsItem *> itemsAtPoint = items(position, Qt::IntersectsItemShape,
                                                      Qt::DescendingOrder, deviceTransform);
    return itemsAtPoint.isEmpty() ? nullptr : itemsAtPoint.first();
}